

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

pContextStackFrame_conflict create_context_stack_frame(void)

{
  pContextStackFrame_conflict pCVar1;
  
  pCVar1 = (pContextStackFrame_conflict)malloc(0x10);
  if (pCVar1 == (pContextStackFrame_conflict)0x0) {
    perror("create_context_stack_frame: malloc failed");
    pCVar1 = (pContextStackFrame_conflict)0x0;
  }
  else {
    pCVar1->next = (pContextStackFrame)0x0;
  }
  return pCVar1;
}

Assistant:

pContextStackFrame create_context_stack_frame()
{
    pContextStackFrame res = malloc(sizeof(ContextStackFrame));
    if (res == NULL)
    {
        perror("create_context_stack_frame: malloc failed");
        return NULL;
    }
    res->next = NULL;
    return res;
}